

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdrloader.cpp
# Opt level: O0

bool oldDecrunch(RGBE *scanline,int len,FILE *file)

{
  byte bVar1;
  int iVar2;
  FILE *in_RDX;
  int in_ESI;
  char *in_RDI;
  int rshift;
  int i;
  int local_24;
  int local_14;
  char *local_10;
  
  bVar1 = 0;
  local_14 = in_ESI;
  local_10 = in_RDI;
  while( true ) {
    if (local_14 < 1) {
      return true;
    }
    iVar2 = fgetc(in_RDX);
    *local_10 = (char)iVar2;
    iVar2 = fgetc(in_RDX);
    local_10[1] = (char)iVar2;
    iVar2 = fgetc(in_RDX);
    local_10[2] = (char)iVar2;
    iVar2 = fgetc(in_RDX);
    local_10[3] = (char)iVar2;
    iVar2 = feof(in_RDX);
    if (iVar2 != 0) break;
    if (((*local_10 == '\x01') && (local_10[1] == '\x01')) && (local_10[2] == '\x01')) {
      for (local_24 = (uint)(byte)local_10[3] << (bVar1 & 0x1f); 0 < local_24;
          local_24 = local_24 + -1) {
        *(undefined4 *)local_10 = *(undefined4 *)(local_10 + -4);
        local_10 = local_10 + 4;
        local_14 = local_14 + -1;
      }
      bVar1 = bVar1 + 8;
    }
    else {
      local_10 = local_10 + 4;
      local_14 = local_14 + -1;
      bVar1 = 0;
    }
  }
  return false;
}

Assistant:

bool oldDecrunch(RGBE *scanline, int len, FILE *file)
{
	int i;
	int rshift = 0;
	
	while (len > 0) {
		scanline[0][R] = fgetc(file);
		scanline[0][G] = fgetc(file);
		scanline[0][B] = fgetc(file);
		scanline[0][E] = fgetc(file);
		if (feof(file))
			return false;

		if (scanline[0][R] == 1 &&
			scanline[0][G] == 1 &&
			scanline[0][B] == 1) {
			for (i = scanline[0][E] << rshift; i > 0; i--) {
				memcpy(&scanline[0][0], &scanline[-1][0], 4);
				scanline++;
				len--;
			}
			rshift += 8;
		}
		else {
			scanline++;
			len--;
			rshift = 0;
		}
	}
	return true;
}